

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O3

fileMetrics *
exrmetrics(fileMetrics *__return_storage_ptr__,char *inFileName,char *outFileName,int part,
          Compression compression,float level,int passes,bool write,bool reread,PixelMode pixelMode,
          bool verbose)

{
  vector<double,_std::allocator<double>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  uint64_t *puVar1;
  bool *pbVar2;
  undefined1 uVar3;
  char *pcVar4;
  bool bVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  undefined2 uVar9;
  Compression CVar10;
  _Alloc_hider _Var11;
  size_type sVar12;
  int iVar13;
  float fVar14;
  _Rb_tree_color _Var15;
  int iVar16;
  size_t sVar17;
  ostream *poVar18;
  Header *pHVar19;
  undefined4 *puVar20;
  int *piVar21;
  float *pfVar22;
  _Rb_tree_node_base *p_Var23;
  _Rb_tree_node_base *p_Var24;
  char *pcVar25;
  MultiPartOutputFile *this_02;
  MultiPartInputFile *this_03;
  runtime_error *prVar26;
  long *plVar27;
  size_type *psVar28;
  __nlink_t *p_Var29;
  pointer ppVar30;
  int p_1;
  long lVar31;
  int p;
  long lVar32;
  ulong uVar33;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> outHeaders;
  vector<partData,_std::allocator<partData>_> parts;
  MultiPartInputFile in;
  stat instats;
  stat outstats;
  MemOStream *local_260;
  allocator<char> local_249;
  vector<double,_std::allocator<double>_> *local_248;
  float local_23c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ulong local_218;
  string *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  float local_1e4;
  Compression *local_1e0;
  MultiPartInputFile local_1d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  char *local_1b8;
  undefined1 local_1b0 [40];
  MemOStream *local_188;
  pointer local_180;
  pointer local_170;
  string local_120 [32];
  undefined1 local_100 [40];
  __dev_t local_d8;
  MemOStream *local_d0;
  string local_70;
  string local_50;
  
  local_248 = (vector<double,_std::allocator<double>_> *)CONCAT44(local_248._4_4_,compression);
  local_23c = level;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"read ",5);
    if (inFileName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x117530);
    }
    else {
      sVar17 = strlen(inFileName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,inFileName,sVar17);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," as ",4);
    modeName_abi_cxx11_((string *)local_1b0,pixelMode);
    poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_1b0._0_8_,local_1b0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar18,"... ",4);
    if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
      operator_delete((void *)local_1b0._0_8_,CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
    }
    std::ostream::flush();
  }
  iVar13 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_1d8,inFileName,iVar13,true);
  if (part == -1) {
    memset(__return_storage_ptr__,0,0xb2);
    (__return_storage_ptr__->totalStats).sizeData.compression = NUM_COMPRESSION_METHODS;
    (__return_storage_ptr__->totalStats).sizeData.partType._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->totalStats).sizeData.partType.field_2;
    (__return_storage_ptr__->totalStats).sizeData.partType._M_string_length = 0;
    (__return_storage_ptr__->totalStats).sizeData.partType.field_2._M_local_buf[0] = '\0';
    iVar13 = Imf_3_4::MultiPartInputFile::parts();
    local_1e0 = &(__return_storage_ptr__->totalStats).sizeData.compression;
  }
  else {
    iVar13 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar13 <= part) {
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>(local_120,inFileName,&local_249);
      plVar27 = (long *)std::__cxx11::string::append((char *)local_120);
      local_208._M_dataplus._M_p = (pointer)*plVar27;
      psVar28 = (size_type *)(plVar27 + 2);
      if ((size_type *)local_208._M_dataplus._M_p == psVar28) {
        local_208.field_2._M_allocated_capacity = *psVar28;
        local_208.field_2._8_8_ = plVar27[3];
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      }
      else {
        local_208.field_2._M_allocated_capacity = *psVar28;
      }
      local_208._M_string_length = plVar27[1];
      *plVar27 = (long)psVar28;
      plVar27[1] = 0;
      *(undefined1 *)(plVar27 + 2) = 0;
      iVar13 = Imf_3_4::MultiPartInputFile::parts();
      std::__cxx11::to_string(&local_50,iVar13);
      std::operator+(&local_238,&local_208,&local_50);
      plVar27 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_100._0_8_ = *plVar27;
      p_Var29 = (__nlink_t *)(plVar27 + 2);
      if ((__nlink_t *)local_100._0_8_ == p_Var29) {
        local_100._16_8_ = *p_Var29;
        local_100._24_8_ = plVar27[3];
        local_100._0_8_ = local_100 + 0x10;
      }
      else {
        local_100._16_8_ = *p_Var29;
      }
      local_100._8_8_ = plVar27[1];
      *plVar27 = (long)p_Var29;
      plVar27[1] = 0;
      *(undefined1 *)(plVar27 + 2) = 0;
      std::__cxx11::to_string(&local_70,part);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     &local_70);
      std::runtime_error::runtime_error(prVar26,(char *)local_1b0._0_8_);
      __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1e0 = &(__return_storage_ptr__->totalStats).sizeData.compression;
    memset(__return_storage_ptr__,0,0xb2);
    (__return_storage_ptr__->totalStats).sizeData.compression = NUM_COMPRESSION_METHODS;
    (__return_storage_ptr__->totalStats).sizeData.partType._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->totalStats).sizeData.partType.field_2;
    (__return_storage_ptr__->totalStats).sizeData.partType._M_string_length = 0;
    (__return_storage_ptr__->totalStats).sizeData.partType.field_2._M_local_buf[0] = '\0';
    iVar13 = 1;
  }
  local_210 = &(__return_storage_ptr__->totalStats).sizeData.partType;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::vector
            ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_238,(long)iVar13,
             (allocator_type *)local_1b0);
  if (part == -1) {
    lVar31 = 0;
    for (lVar32 = 0; iVar13 = Imf_3_4::MultiPartInputFile::parts(), lVar32 < iVar13;
        lVar32 = lVar32 + 1) {
      pHVar19 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_1d8);
      Imf_3_4::Header::operator=((Header *)(local_238._M_dataplus._M_p + lVar31),pHVar19);
      lVar31 = lVar31 + 0x38;
    }
  }
  else {
    pHVar19 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_1d8);
    Imf_3_4::Header::operator=((Header *)local_238._M_dataplus._M_p,pHVar19);
  }
  fVar14 = ABS(local_23c);
  bVar5 = -1.0 <= local_23c;
  local_1e4 = (float)(int)local_23c;
  lVar31 = 0;
  local_218 = 0;
  local_1b8 = inFileName;
  do {
    iVar13 = Imf_3_4::MultiPartInputFile::parts();
    CVar10 = (Compression)local_248;
    if (iVar13 <= lVar31) {
      if ((!bVar5 || fVar14 == INFINITY) || (local_218 & 1) != 0) {
        iVar13 = 1;
        if (part == -1) {
          iVar13 = Imf_3_4::MultiPartInputFile::parts();
        }
        std::vector<partData,_std::allocator<partData>_>::vector
                  ((vector<partData,_std::allocator<partData>_> *)&local_208,(long)iVar13,
                   (allocator_type *)local_1b0);
        std::vector<partStats,_std::allocator<partStats>_>::resize
                  (&__return_storage_ptr__->stats,
                   ((long)(local_208._M_string_length - (long)local_208._M_dataplus._M_p) >> 4) *
                   0x14c1bacf914c1bad);
        initAndReadFile(local_1d8,
                        (vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_238,part
                        ,(vector<partData,_std::allocator<partData>_> *)&local_208,
                        __return_storage_ptr__,reread);
        if (write) {
          if (outFileName == (char *)0x0) {
            Imf_3_4::OStream::OStream((OStream *)local_1b0,"<dummy>");
            sVar12 = local_238._M_string_length;
            _Var11._M_p = local_238._M_dataplus._M_p;
            local_1b0._0_8_ = &PTR__OStream_00115c10;
            local_188 = (MemOStream *)0x0;
            iVar13 = Imf_3_4::globalThreadCount();
            Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                      ((MultiPartOutputFile *)local_100,(OStream *)local_1b0,(Header *)_Var11._M_p,
                       (int)(sVar12 - (long)_Var11._M_p >> 3) * -0x49249249,false,iVar13);
            writeFile((MultiPartOutputFile *)local_100,
                      (vector<partData,_std::allocator<partData>_> *)&local_208,
                      __return_storage_ptr__,false);
            local_260 = local_188;
            Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)local_100);
            Imf_3_4::OStream::~OStream((OStream *)local_1b0);
          }
          else {
            local_260 = (MemOStream *)0x0;
          }
          if (verbose) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," write ",7);
            if (CVar10 != NUM_COMPRESSION_METHODS) {
              local_1b0._8_8_ = 0;
              local_1b0[0x10] = '\0';
              local_1b0._0_8_ = local_1b0 + 0x10;
              Imf_3_4::getCompressionNameFromId(CVar10,(string *)local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"compression ",0xc);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(char *)local_1b0._0_8_,local_1b0._8_8_);
              if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) {
                operator_delete((void *)local_1b0._0_8_,
                                CONCAT71(local_1b0._17_7_,local_1b0[0x10]) + 1);
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"... ",4);
            std::ostream::flush();
          }
          if (0 < passes) {
            iVar13 = 0;
            do {
              if (passes != 1 && verbose) {
                poVar18 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar13);
                local_1b0[0] = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)local_1b0,1);
                std::ostream::flush();
              }
              MemOStream::MemOStream((MemOStream *)local_1b0,(uint64_t)local_260);
              if (outFileName == (char *)0x0) {
                this_02 = (MultiPartOutputFile *)operator_new(0x10);
                sVar12 = local_238._M_string_length;
                _Var11._M_p = local_238._M_dataplus._M_p;
                iVar16 = Imf_3_4::globalThreadCount();
                Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                          (this_02,(OStream *)local_1b0,(Header *)_Var11._M_p,
                           (int)(sVar12 - (long)_Var11._M_p >> 3) * -0x49249249,false,iVar16);
              }
              else {
                this_02 = (MultiPartOutputFile *)operator_new(0x10);
                sVar12 = local_238._M_string_length;
                _Var11._M_p = local_238._M_dataplus._M_p;
                iVar16 = Imf_3_4::globalThreadCount();
                Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
                          (this_02,outFileName,(Header *)_Var11._M_p,
                           (int)(sVar12 - (long)_Var11._M_p >> 3) * -0x49249249,false,iVar16);
              }
              writeFile(this_02,(vector<partData,_std::allocator<partData>_> *)&local_208,
                        __return_storage_ptr__,true);
              (**(code **)(*(long *)this_02 + 8))(this_02);
              if (reread) {
                Imf_3_4::IStream::IStream((IStream *)local_100,"<memory>");
                local_100._0_8_ = &PTR__IStream_00115cb0;
                local_d8 = 0;
                local_d0 = (MemOStream *)local_1b0;
                if (outFileName == (char *)0x0) {
                  this_03 = (MultiPartInputFile *)operator_new(0x20);
                  iVar16 = Imf_3_4::globalThreadCount();
                  Imf_3_4::MultiPartInputFile::MultiPartInputFile
                            (this_03,(IStream *)local_100,iVar16,true);
                }
                else {
                  this_03 = (MultiPartInputFile *)operator_new(0x20);
                  iVar16 = Imf_3_4::globalThreadCount();
                  Imf_3_4::MultiPartInputFile::MultiPartInputFile(this_03,outFileName,iVar16,true);
                }
                rereadFile(this_03,(vector<partData,_std::allocator<partData>_> *)&local_208,
                           __return_storage_ptr__);
                if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_03 + 0x18) !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_03 + 0x18));
                }
                if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_03 + 8) !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this_03 + 8));
                }
                operator_delete(this_03,0x20);
                Imf_3_4::IStream::~IStream((IStream *)local_100);
              }
              local_1b0._0_8_ = &PTR__MemOStream_00115c60;
              if (local_180 != (pointer)0x0) {
                operator_delete(local_180,(long)local_170 - (long)local_180);
              }
              Imf_3_4::OStream::~OStream((OStream *)local_1b0);
              iVar13 = iVar13 + 1;
            } while (passes != iVar13);
          }
          stat(local_1b8,(stat *)local_1b0);
          __return_storage_ptr__->inputFileSize = (uint64_t)local_180;
          if (outFileName != (char *)0x0) {
            stat(outFileName,(stat *)local_100);
            local_260 = local_d0;
          }
          __return_storage_ptr__->outputFileSize = (uint64_t)local_260;
        }
        ppVar30 = (__return_storage_ptr__->stats).
                  super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                  super__Vector_impl_data._M_start;
        std::vector<double,_std::allocator<double>_>::operator=
                  (&(__return_storage_ptr__->totalStats).countReadPerf,&ppVar30->countReadPerf);
        local_248 = &(__return_storage_ptr__->totalStats).readPerf;
        std::vector<double,_std::allocator<double>_>::operator=(local_248,&ppVar30->readPerf);
        this = &(__return_storage_ptr__->totalStats).writePerf;
        std::vector<double,_std::allocator<double>_>::operator=(this,&ppVar30->writePerf);
        this_00 = &(__return_storage_ptr__->totalStats).countRereadPerf;
        std::vector<double,_std::allocator<double>_>::operator=(this_00,&ppVar30->countRereadPerf);
        this_01 = &(__return_storage_ptr__->totalStats).rereadPerf;
        std::vector<double,_std::allocator<double>_>::operator=(this_01,&ppVar30->rereadPerf);
        bVar5 = (ppVar30->sizeData).isTiled;
        uVar9 = *(undefined2 *)&(ppVar30->sizeData).field_0x22;
        CVar10 = (ppVar30->sizeData).compression;
        (__return_storage_ptr__->totalStats).sizeData.isDeep = (ppVar30->sizeData).isDeep;
        (__return_storage_ptr__->totalStats).sizeData.isTiled = bVar5;
        *(undefined2 *)&(__return_storage_ptr__->totalStats).sizeData.field_0x22 = uVar9;
        (__return_storage_ptr__->totalStats).sizeData.compression = CVar10;
        uVar6 = (ppVar30->sizeData).rawSize;
        uVar7 = (ppVar30->sizeData).pixelCount;
        uVar8 = (ppVar30->sizeData).tileCount;
        (__return_storage_ptr__->totalStats).sizeData.channelCount =
             (ppVar30->sizeData).channelCount;
        (__return_storage_ptr__->totalStats).sizeData.tileCount = uVar8;
        (__return_storage_ptr__->totalStats).sizeData.rawSize = uVar6;
        (__return_storage_ptr__->totalStats).sizeData.pixelCount = uVar7;
        std::__cxx11::string::_M_assign
                  ((string *)&(__return_storage_ptr__->totalStats).sizeData.partType);
        ppVar30 = (__return_storage_ptr__->stats).
                  super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (1 < (ulong)(((long)(__return_storage_ptr__->stats).
                               super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)ppVar30 >> 6) *
                       -0x5555555555555555)) {
          uVar33 = 1;
          lVar31 = 0xc0;
          do {
            accumulate(local_248,
                       (vector<double,_std::allocator<double>_> *)
                       ((long)&(ppVar30->readPerf).
                               super__Vector_base<double,_std::allocator<double>_> + lVar31));
            accumulate(&(__return_storage_ptr__->totalStats).countReadPerf,
                       (vector<double,_std::allocator<double>_> *)
                       ((long)&(((__return_storage_ptr__->stats).
                                 super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                                 super__Vector_impl_data._M_start)->countReadPerf).
                               super__Vector_base<double,_std::allocator<double>_> + lVar31));
            accumulate(this,(vector<double,_std::allocator<double>_> *)
                            ((long)&(((__return_storage_ptr__->stats).
                                      super__Vector_base<partStats,_std::allocator<partStats>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->writePerf).
                                    super__Vector_base<double,_std::allocator<double>_> + lVar31));
            accumulate(this_01,(vector<double,_std::allocator<double>_> *)
                               ((long)&(((__return_storage_ptr__->stats).
                                         super__Vector_base<partStats,_std::allocator<partStats>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->rereadPerf).
                                       super__Vector_base<double,_std::allocator<double>_> + lVar31)
                      );
            accumulate(this_00,(vector<double,_std::allocator<double>_> *)
                               ((long)&(((__return_storage_ptr__->stats).
                                         super__Vector_base<partStats,_std::allocator<partStats>_>.
                                         _M_impl.super__Vector_impl_data._M_start)->countRereadPerf)
                                       .super__Vector_base<double,_std::allocator<double>_> + lVar31
                               ));
            ppVar30 = (__return_storage_ptr__->stats).
                      super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar1 = &(__return_storage_ptr__->totalStats).sizeData.channelCount;
            *puVar1 = *puVar1 + *(long *)((long)&(ppVar30->sizeData).channelCount + lVar31);
            plVar27 = (long *)((long)&(ppVar30->sizeData).rawSize + lVar31);
            lVar32 = plVar27[1];
            uVar6 = (__return_storage_ptr__->totalStats).sizeData.pixelCount;
            (__return_storage_ptr__->totalStats).sizeData.rawSize =
                 (__return_storage_ptr__->totalStats).sizeData.rawSize + *plVar27;
            (__return_storage_ptr__->totalStats).sizeData.pixelCount = uVar6 + lVar32;
            puVar1 = &(__return_storage_ptr__->totalStats).sizeData.tileCount;
            *puVar1 = *puVar1 + *(long *)((long)&(ppVar30->sizeData).tileCount + lVar31);
            pbVar2 = &(__return_storage_ptr__->totalStats).sizeData.isDeep;
            *pbVar2 = (bool)(*pbVar2 | *(byte *)((long)&(ppVar30->sizeData).isDeep + lVar31));
            pbVar2 = &(__return_storage_ptr__->totalStats).sizeData.isTiled;
            *pbVar2 = (bool)(*pbVar2 | *(byte *)((long)&(ppVar30->sizeData).isTiled + lVar31));
            if (*(Compression *)((long)&(ppVar30->sizeData).compression + lVar31) !=
                (__return_storage_ptr__->totalStats).sizeData.compression) {
              *local_1e0 = NUM_COMPRESSION_METHODS;
            }
            pcVar25 = *(char **)((long)&(ppVar30->sizeData).partType + lVar31 + 8U);
            pcVar4 = (char *)(__return_storage_ptr__->totalStats).sizeData.partType._M_string_length
            ;
            if ((pcVar25 != pcVar4) ||
               ((pcVar25 != (char *)0x0 &&
                (iVar13 = bcmp(*(void **)((long)&(ppVar30->sizeData).partType + lVar31),
                               (local_210->_M_dataplus)._M_p,(size_t)pcVar25), iVar13 != 0)))) {
              std::__cxx11::string::_M_replace((ulong)local_210,0,pcVar4,0x110a31);
              ppVar30 = (__return_storage_ptr__->stats).
                        super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                        super__Vector_impl_data._M_start;
            }
            uVar33 = uVar33 + 1;
            lVar31 = lVar31 + 0xc0;
          } while (uVar33 < (ulong)(((long)(__return_storage_ptr__->stats).
                                           super__Vector_base<partStats,_std::allocator<partStats>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppVar30 >> 6) * -0x5555555555555555));
        }
        if (verbose) {
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
          std::ostream::put('0');
          std::ostream::flush();
        }
        std::vector<partData,_std::allocator<partData>_>::~vector
                  ((vector<partData,_std::allocator<partData>_> *)&local_208);
        std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::~vector
                  ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)&local_238);
        if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
        }
        if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
        }
        return __return_storage_ptr__;
      }
      prVar26 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar26,"-l option only works for DWAA/DWAB,ZIP/ZIPS or ZSTD compression");
      __cxa_throw(prVar26,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((int)(Compression)local_248 < 10) {
      puVar20 = (undefined4 *)Imf_3_4::Header::compression();
      *puVar20 = (Compression)local_248;
    }
    if (bVar5 && fVar14 != INFINITY) {
      piVar21 = (int *)Imf_3_4::Header::compression();
      if (*piVar21 - 2U < 2) {
        pfVar22 = (float *)Imf_3_4::Header::zipCompressionLevel();
        *pfVar22 = local_1e4;
      }
      else {
        if (1 < *piVar21 - 8U) goto LAB_0010ce39;
        pfVar22 = (float *)Imf_3_4::Header::dwaCompressionLevel();
        *pfVar22 = local_23c;
      }
      local_218 = CONCAT71((int7)((ulong)pfVar22 >> 8),1);
    }
LAB_0010ce39:
    if (pixelMode != PIXELMODE_ORIGINAL) {
      Imf_3_4::Header::channels();
      p_Var23 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
      while( true ) {
        Imf_3_4::Header::channels();
        p_Var24 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
        if (p_Var23 == p_Var24) break;
        pcVar25 = strrchr((char *)(p_Var23 + 1),0x72);
        p_Var24 = (_Rb_tree_node_base *)(pcVar25 + 1);
        if (pcVar25 == (char *)0x0) {
          p_Var24 = p_Var23 + 1;
        }
        _Var15 = pixelMode;
        if (pixelMode == PIXELMODE_ALL_HALF) {
LAB_0010ced4:
          p_Var23[9]._M_color = _Var15;
        }
        else {
          if (pixelMode == PIXELMODE_MIXED_HALF_FLOAT) {
            uVar3 = (undefined1)p_Var24->_M_color;
            if ((byte)uVar3 < 0x47) {
              if ((uVar3 == 0x41) || (uVar3 == 0x42)) {
LAB_0010cec9:
                if (*(byte *)((long)&p_Var24->_M_color + 1) == 0) {
                  _Var15 = _S_black;
                  goto LAB_0010ced4;
                }
              }
            }
            else if ((uVar3 == 0x47) || (uVar3 == 0x52)) goto LAB_0010cec9;
LAB_0010cecf:
            _Var15 = 2;
            goto LAB_0010ced4;
          }
          if ((pixelMode & ~PIXELMODE_ALL_HALF) == PIXELMODE_ALL_FLOAT) goto LAB_0010cecf;
        }
        p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
      }
    }
    lVar31 = lVar31 + 1;
  } while( true );
}

Assistant:

fileMetrics
exrmetrics (
    const char*                        inFileName,
    const char*                        outFileName,
    int                                part,
    OPENEXR_IMF_NAMESPACE::Compression compression,
    float                              level,
    int                                passes,
    bool                               write,
    bool                               reread,
    PixelMode                          pixelMode,
    bool                               verbose)
{

    if (verbose)
    {
        cerr << "read " << inFileName;
        cerr << " as " << modeName (pixelMode) << "... ";
        cerr.flush ();
    }

    MultiPartInputFile in (inFileName);
    if (part != -1 && part >= in.parts ())
    {
        throw runtime_error ((string (inFileName) + " only contains " +
                              to_string (in.parts ()) +
                              " parts. Cannot copy part " + to_string (part))
                                 .c_str ());
    }
    fileMetrics metrics;

    //write all parts if part==-1, otherwise write single part specified
    vector<Header> outHeaders (part == -1 ? in.parts () : 1);
    if (part == -1)
    {
        for (int p = 0; p < in.parts (); ++p)
        {
            outHeaders[p] = in.header (p);
        }
    }
    else { outHeaders[0] = in.header (part); }

    bool compressionSet = false;

    for (int p = 0; p < in.parts (); ++p)
    {
        if (compression < NUM_COMPRESSION_METHODS)
        {
            outHeaders[p].compression () = compression;
        }

        if (!isinf (level) && level >= -1)
        {
            switch (outHeaders[p].compression ())
            {
                case DWAA_COMPRESSION:
                case DWAB_COMPRESSION:
                    outHeaders[p].dwaCompressionLevel () = level;
                    compressionSet                       = true;
                    break;
                case ZIP_COMPRESSION:
                case ZIPS_COMPRESSION:
                    outHeaders[p].zipCompressionLevel () = level;
                    compressionSet                       = true;
                    break;
                    //            case ZSTD_COMPRESSION :
                    //                outHeader.zstdCompressionLevel()=level;
                    //                break;
                default: break;
            }
        }

        if (pixelMode != PIXELMODE_ORIGINAL)
        {
            for (ChannelList::Iterator i = outHeaders[p].channels ().begin ();
                 i != outHeaders[p].channels ().end ();
                 ++i)
            {
                // find channel suffix within full channel name (so 'R' in 'layer.R')
                const char* name = i.name ();
                const char* dot  = strrchr (name, 'r');
                if (dot) { name = dot + 1; }

                if (pixelMode == PIXELMODE_ALL_HALF ||
                    (pixelMode == PIXELMODE_MIXED_HALF_FLOAT &&
                     (!strcmp (name, "R") || !strcmp (name, "G") ||
                      !strcmp (name, "B") || !strcmp (name, "A"))))
                {
                    i.channel ().type = HALF;
                }
                else if (
                    pixelMode == PIXELMODE_ALL_FLOAT ||
                    pixelMode == PIXELMODE_MIXED_HALF_FLOAT)
                {
                    i.channel ().type = FLOAT;
                }
            }
        }
    }

    // abort if level was set but no parts had a compression type with a level
    if (!isinf (level) && level >= -1 && !compressionSet)
    {
        throw runtime_error (
            "-l option only works for DWAA/DWAB,ZIP/ZIPS or ZSTD compression");
    }

    vector<partData> parts (part == -1 ? in.parts () : 1);
    metrics.stats.resize (parts.size ());

    initAndReadFile (in, outHeaders, part, parts, metrics, reread);

    if (write)
    {

        //
        // when NOT writing to file, write to preallocated block of data
        // precompute the total datasize, so no memory reallocation is required
        //
        uint64_t fileSize = 0;
        if (!outFileName)
        {

            DummyOStream        tmp;
            MultiPartOutputFile out (
                tmp, outHeaders.data (), outHeaders.size ());
            writeFile (out, parts, metrics, false);
            fileSize = tmp.tellp ();
        }

        //
        // write to output; re-read output back to input
        //

        if (verbose)
        {
            cerr << " write ";
            if (compression != NUM_COMPRESSION_METHODS)
            {
                string name;
                getCompressionNameFromId (compression, name);
                cerr << "compression " << name;
            }
            cerr << "... ";
            cerr.flush ();
        }

        for (int i = 0; i < passes; ++i)
        {
            if (verbose && passes > 1)
            {
                cerr << i << ' ';
                cerr.flush ();
            }
            MemOStream           ostream (fileSize);
            MultiPartOutputFile* out;
            if (outFileName)
            {
                out = new MultiPartOutputFile (
                    outFileName, outHeaders.data (), outHeaders.size ());
            }
            else
            {
                out = new MultiPartOutputFile (
                    ostream, outHeaders.data (), outHeaders.size ());
            }
            writeFile (*out, parts, metrics, true);
            delete out;

            if (reread)
            {
                MemIStream          istream (ostream);
                MultiPartInputFile* in;
                if (outFileName) { in = new MultiPartInputFile (outFileName); }
                else { in = new MultiPartInputFile (istream); }

                rereadFile (*in, parts, metrics);

                delete in;
            }
        }

        struct stat instats, outstats;
        stat (inFileName, &instats);
        metrics.inputFileSize = instats.st_size;
        if (outFileName)
        {
            stat (outFileName, &outstats);
            metrics.outputFileSize = outstats.st_size;
        }
        else { metrics.outputFileSize = fileSize; }
    }

    //
    // sum across all parts
    //

    metrics.totalStats = metrics.stats[0];
    for (size_t i = 1; i < metrics.stats.size (); ++i)
    {
        accumulate (metrics.totalStats.readPerf, metrics.stats[i].readPerf);
        accumulate (
            metrics.totalStats.countReadPerf, metrics.stats[i].countReadPerf);
        accumulate (metrics.totalStats.writePerf, metrics.stats[i].writePerf);
        accumulate (metrics.totalStats.rereadPerf, metrics.stats[i].rereadPerf);
        accumulate (
            metrics.totalStats.countRereadPerf,
            metrics.stats[i].countRereadPerf);

        metrics.totalStats.sizeData.pixelCount +=
            metrics.stats[i].sizeData.pixelCount;
        metrics.totalStats.sizeData.channelCount +=
            metrics.stats[i].sizeData.channelCount;
        metrics.totalStats.sizeData.rawSize +=
            metrics.stats[i].sizeData.rawSize;
        metrics.totalStats.sizeData.tileCount +=
            metrics.stats[i].sizeData.tileCount;

        metrics.totalStats.sizeData.isDeep |= metrics.stats[i].sizeData.isDeep;
        metrics.totalStats.sizeData.isTiled |=
            metrics.stats[i].sizeData.isTiled;

        //check for mixed compression or part types within file

        if (metrics.stats[i].sizeData.compression !=
            metrics.totalStats.sizeData.compression)
        {
            metrics.totalStats.sizeData.compression = NUM_COMPRESSION_METHODS;
        }
        if (metrics.stats[i].sizeData.partType !=
            metrics.totalStats.sizeData.partType)
        {
            metrics.totalStats.sizeData.partType = "";
        }
    }

    if (verbose) { cerr << endl; }
    return metrics;
}